

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_endpointer.c
# Opt level: O0

ps_endpointer_t *
ps_endpointer_init(double window,double ratio,ps_vad_mode_t mode,int sample_rate,double frame_length
                  )

{
  int iVar1;
  ps_endpointer_t *ep_00;
  ps_vad_t *ppVar2;
  size_t sVar3;
  int16 *piVar4;
  int8 *piVar5;
  undefined1 auVar6 [16];
  ps_endpointer_t *ep;
  double frame_length_local;
  int sample_rate_local;
  ps_vad_mode_t mode_local;
  double ratio_local;
  double window_local;
  
  ep_00 = (ps_endpointer_t *)
          __ckd_calloc__(1,0x68,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
                         ,0x3b);
  ep_00->refcount = 1;
  ppVar2 = ps_vad_init(mode,sample_rate,frame_length);
  ep_00->vad = ppVar2;
  if (ppVar2 != (ps_vad_t *)0x0) {
    ratio_local = window;
    if ((window == 0.0) && (!NAN(window))) {
      ratio_local = 0.3;
    }
    _sample_rate_local = ratio;
    if ((ratio == 0.0) && (!NAN(ratio))) {
      _sample_rate_local = 0.9;
    }
    sVar3 = ps_vad_frame_size(ep_00->vad);
    auVar6._8_4_ = (int)(sVar3 >> 0x20);
    auVar6._0_8_ = sVar3;
    auVar6._12_4_ = 0x45300000;
    iVar1 = ps_vad_sample_rate(ep_00->vad);
    ep_00->frame_length =
         ((auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) / (double)iVar1;
    ep_00->maxlen = (int)(ratio_local / ep_00->frame_length + 0.5);
    ep_00->start_frames = (int)(_sample_rate_local * (double)ep_00->maxlen);
    ep_00->end_frames = (int)((1.0 - _sample_rate_local) * (double)ep_00->maxlen + 0.5);
    if ((ep_00->start_frames < 1) || (ep_00->maxlen <= ep_00->start_frames)) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
              ,0x4a,"Ratio %.2f makes start-pointing stupid or impossible (%d frames of %d)\n",
              _sample_rate_local,(ulong)(uint)ep_00->start_frames,(ulong)(uint)ep_00->maxlen);
    }
    else {
      if ((0 < ep_00->end_frames) && (ep_00->end_frames < ep_00->maxlen)) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
                ,0x54,"Threshold %d%% of %.3fs window (>%d frames <%d frames of %d)\n",
                (double)ep_00->maxlen * ep_00->frame_length,
                (ulong)(uint)(int)(_sample_rate_local * 100.0 + 0.5),
                (ulong)(uint)ep_00->start_frames,ep_00->end_frames,ep_00->maxlen);
        ppVar2 = ps_endpointer_vad(ep_00);
        sVar3 = ps_vad_frame_size(ppVar2);
        ep_00->frame_size = (int)sVar3;
        piVar4 = (int16 *)__ckd_calloc__(2,(long)(ep_00->maxlen * ep_00->frame_size),
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
                                         ,0x57);
        ep_00->buf = piVar4;
        piVar5 = (int8 *)__ckd_calloc__(1,(long)ep_00->maxlen,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
                                        ,0x58);
        ep_00->is_speech = piVar5;
        ep_00->n = 0;
        ep_00->pos = 0;
        return ep_00;
      }
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
              ,0x4f,"Ratio %.2f makes end-pointing stupid or impossible (%d frames of %d)\n",
              _sample_rate_local,(ulong)(uint)ep_00->end_frames,(ulong)(uint)ep_00->maxlen);
    }
  }
  ps_endpointer_free(ep_00);
  return (ps_endpointer_t *)0x0;
}

Assistant:

ps_endpointer_t *
ps_endpointer_init(double window,
                   double ratio,
                   ps_vad_mode_t mode,
                   int sample_rate, double frame_length)
{
    ps_endpointer_t *ep = ckd_calloc(1, sizeof(*ep));
    ep->refcount = 1;
    if ((ep->vad = ps_vad_init(mode, sample_rate, frame_length)) == NULL)
        goto error_out;
    if (window == 0.0)
        window = PS_ENDPOINTER_DEFAULT_WINDOW;
    if (ratio == 0.0)
        ratio = PS_ENDPOINTER_DEFAULT_RATIO;
    ep->frame_length = ps_vad_frame_length(ep->vad);
    ep->maxlen = (int)(window / ep->frame_length + 0.5);
    ep->start_frames = (int)(ratio * ep->maxlen);
    ep->end_frames = (int)((1.0 - ratio) * ep->maxlen + 0.5);
    /* Make sure endpointing is possible ;-) */
    if (ep->start_frames <= 0 || ep->start_frames >= ep->maxlen) {
        E_ERROR("Ratio %.2f makes start-pointing stupid or impossible (%d frames of %d)\n",
                ratio, ep->start_frames, ep->maxlen);
        goto error_out;
    }
    if (ep->end_frames <= 0 || ep->end_frames >= ep->maxlen) {
        E_ERROR("Ratio %.2f makes end-pointing stupid or impossible (%d frames of %d)\n",
                ratio, ep->end_frames, ep->maxlen);
        goto error_out;
    }
    E_INFO("Threshold %d%% of %.3fs window (>%d frames <%d frames of %d)\n",
           (int)(ratio * 100.0 + 0.5),
           ep->maxlen * ep->frame_length, ep->start_frames, ep->end_frames, ep->maxlen);
    ep->frame_size = ps_endpointer_frame_size(ep);
    ep->buf = ckd_calloc(sizeof(*ep->buf),
                         ep->maxlen * ep->frame_size);
    ep->is_speech = ckd_calloc(1, ep->maxlen);
    ep->pos = ep->n = 0;
    return ep;
error_out:
    ps_endpointer_free(ep);
    return NULL;
}